

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTagger.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::CoreMLModels::WordTagger::ByteSizeLong(WordTagger *this)

{
  size_type sVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  
  sVar1 = ((this->language_).ptr_)->_M_string_length;
  if (sVar1 == 0) {
    sVar5 = 0;
  }
  else {
    uVar4 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar1 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar1 = ((this->tokensoutputfeaturename_).ptr_)->_M_string_length;
  if (sVar1 != 0) {
    uVar4 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar5 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
  }
  sVar1 = ((this->tokentagsoutputfeaturename_).ptr_)->_M_string_length;
  if (sVar1 != 0) {
    uVar4 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar5 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
  }
  sVar1 = ((this->tokenlocationsoutputfeaturename_).ptr_)->_M_string_length;
  if (sVar1 != 0) {
    uVar4 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar5 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
  }
  sVar1 = ((this->tokenlengthsoutputfeaturename_).ptr_)->_M_string_length;
  if (sVar1 != 0) {
    uVar4 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar5 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
  }
  sVar1 = ((this->modelparameterdata_).ptr_)->_M_string_length;
  if (sVar1 != 0) {
    uVar4 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar5 + sVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
  }
  if (this->revision_ != 0) {
    uVar4 = this->revision_ | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar5 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->_oneof_case_[0] == 200) {
    sVar3 = StringVector::ByteSizeLong((this->Tags_).stringtags_);
    uVar4 = (uint)sVar3 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar5 = sVar5 + sVar3 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t WordTagger::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.WordTagger)
  size_t total_size = 0;

  // string language = 10;
  if (this->language().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->language());
  }

  // string tokensOutputFeatureName = 20;
  if (this->tokensoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->tokensoutputfeaturename());
  }

  // string tokenTagsOutputFeatureName = 21;
  if (this->tokentagsoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->tokentagsoutputfeaturename());
  }

  // string tokenLocationsOutputFeatureName = 22;
  if (this->tokenlocationsoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->tokenlocationsoutputfeaturename());
  }

  // string tokenLengthsOutputFeatureName = 23;
  if (this->tokenlengthsoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->tokenlengthsoutputfeaturename());
  }

  // bytes modelParameterData = 100;
  if (this->modelparameterdata().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::BytesSize(
        this->modelparameterdata());
  }

  // uint32 revision = 1;
  if (this->revision() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt32Size(
        this->revision());
  }

  switch (Tags_case()) {
    // .CoreML.Specification.StringVector stringTags = 200;
    case kStringTags: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Tags_.stringtags_);
      break;
    }
    case TAGS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}